

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::XFBCaptureInactiveOutputVariableTest::getShaderInterface
          (XFBCaptureInactiveOutputVariableTest *this,GLuint test_case_index,STAGES stage,
          string *out_interface)

{
  TestError *this_00;
  char *local_28;
  GLchar *interface;
  string *out_interface_local;
  STAGES stage_local;
  GLuint test_case_index_local;
  XFBCaptureInactiveOutputVariableTest *this_local;
  
  local_28 = "";
  switch(stage) {
  case VERTEX:
    if (test_case_index == 0) {
      local_28 = getShaderInterface::vs_tes_gs;
    }
    break;
  case TESS_CTRL:
    break;
  case TESS_EVAL:
    if (test_case_index == 1) {
      local_28 = getShaderInterface::vs_tes_gs;
    }
    break;
  case GEOMETRY:
    if (test_case_index == 2) {
      local_28 = getShaderInterface::vs_tes_gs;
    }
    break;
  case FRAGMENT:
    local_28 = getShaderInterface::fs;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x6567);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::operator=((string *)out_interface,local_28);
  return;
}

Assistant:

void XFBCaptureInactiveOutputVariableTest::getShaderInterface(GLuint test_case_index, Utils::Shader::STAGES stage,
															  std::string& out_interface)
{
	static const GLchar* vs_tes_gs = "const uint sizeof_type = 16;\n"
									 "\n"
									 "layout (xfb_offset = 1 * sizeof_type) out vec4 goku;\n"
									 "layout (xfb_offset = 2 * sizeof_type) out vec4 gohan;\n"
									 "layout (xfb_offset = 0 * sizeof_type) out vec4 goten;\n"
									 "\n"
									 "layout(binding = 0) uniform block {\n"
									 "    vec4 uni_gohan;\n"
									 "    vec4 uni_goten;\n"
									 "};\n";
	static const GLchar* fs = "in vec4 goku;\n"
							  "in vec4 gohan;\n"
							  "in vec4 goten;\n"
							  "out vec4 fs_out;\n";

	const GLchar* interface = "";

	switch (stage)
	{
	case Utils::Shader::FRAGMENT:
		interface = fs;
		break;

	case Utils::Shader::GEOMETRY:
		if (TEST_GS == test_case_index)
		{
			interface = vs_tes_gs;
		}
		break;

	case Utils::Shader::TESS_CTRL:
		break;

	case Utils::Shader::TESS_EVAL:
		if (TEST_TES == test_case_index)
		{
			interface = vs_tes_gs;
		}
		break;

	case Utils::Shader::VERTEX:
		if (TEST_VS == test_case_index)
		{
			interface = vs_tes_gs;
		}
		break;

	default:
		TCU_FAIL("Invalid enum");
	}

	out_interface = interface;
}